

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanStringTemplateBegin
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *pp)

{
  EncodedCharPtr last_00;
  OLECHAR OVar1;
  EncodedCharPtr last;
  OLECHAR ch;
  EncodedCharPtr *pp_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<true,true>
            ((Scanner<UTF8EncodingPolicyBase<false>> *)this,L'`',pp);
  last_00 = this->m_pchLast;
  OVar1 = UTF8EncodingPolicyBase<false>::ReadFirst(pp,last_00);
  if (OVar1 == L'`') {
    this_local._4_4_ = tkStrTmplBasic;
  }
  else if ((OVar1 == L'$') &&
          (OVar1 = UTF8EncodingPolicyBase<false>::ReadFirst(pp,last_00), OVar1 == L'{')) {
    this->m_fStringTemplateDepth = this->m_fStringTemplateDepth + 1;
    this_local._4_4_ = tkStrTmplBegin;
  }
  else {
    *pp = *pp + -1;
    this_local._4_4_ = ScanError(this,this->m_currentCharacter,tkStrTmplBegin);
  }
  return this_local._4_4_;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringTemplateBegin(EncodedCharPtr *pp)
{
    // String template must begin with a string constant followed by '`' or '${'
    ScanStringConstant<true, true>('`', pp);

    OLECHAR ch;
    EncodedCharPtr last = m_pchLast;

    ch = this->ReadFirst(*pp, last);

    if (ch == '`')
    {
        // Simple string template - no substitutions
        return tkStrTmplBasic;
    }
    else if (ch == '$')
    {
        ch = this->ReadFirst(*pp, last);

        if (ch == '{')
        {
            // Next token after expr should be tkStrTmplMid or tkStrTmplEnd.
            // In string template scanning mode, we expect the next char to be '}'
            // and will treat it as the beginning of tkStrTmplEnd or tkStrTmplMid
            m_fStringTemplateDepth++;

            // Regular string template begin - next is first substitution
            return tkStrTmplBegin;
        }
    }

    // Error - make sure pointer stays at the last character of the error token instead of after it in the error case
    (*pp)--;
    return ScanError(m_currentCharacter, tkStrTmplBegin);
}